

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-hmac.c
# Opt level: O2

int ndn_hmac_sign(uint8_t *input_value,uint32_t input_size,uint8_t *output_value,
                 uint32_t output_max_size,ndn_hmac_key_t *hmac_key,uint32_t *output_used_size)

{
  int iVar1;
  
  if (output_max_size < 0x20) {
    return -10;
  }
  iVar1 = ndn_hmac_sha256(input_value,input_size,hmac_key,output_value);
  if (iVar1 == 0) {
    *output_used_size = 0x20;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
ndn_hmac_sign(const uint8_t* input_value, uint32_t input_size,
              uint8_t* output_value, uint32_t output_max_size,
              const ndn_hmac_key_t* hmac_key,
              uint32_t* output_used_size)
{
  if (output_max_size < NDN_SEC_SHA256_HASH_SIZE)
    return NDN_OVERSIZE;
  int ret_val = ndn_hmac_sha256(input_value, input_size, hmac_key, output_value);
  if (ret_val != NDN_SUCCESS) {
    return ret_val;
  }
  *output_used_size = NDN_SEC_SHA256_HASH_SIZE;
  return NDN_SUCCESS;
}